

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

EAttrib strToEAttrib(CStr str)

{
  bool bVar1;
  undefined1 local_20 [8];
  CStr str_local;
  
  str_local._0_8_ = str._str;
  local_20._0_4_ = str._size;
  bVar1 = tl::CStrT<char>::operator==((CStrT<char> *)local_20,"POSITION");
  if (bVar1) {
    str_local._str._7_1_ = POSITION;
  }
  else {
    bVar1 = tl::CStrT<char>::operator==((CStrT<char> *)local_20,"NORMAL");
    if (bVar1) {
      str_local._str._7_1_ = NORMAL;
    }
    else {
      bVar1 = tl::CStrT<char>::operator==((CStrT<char> *)local_20,"TANGENT");
      if (bVar1) {
        str_local._str._7_1_ = TANGENT;
      }
      else {
        bVar1 = tl::CStrT<char>::operator==((CStrT<char> *)local_20,"TEXCOORD_0");
        if (bVar1) {
          str_local._str._7_1_ = TEXCOORD_0;
        }
        else {
          bVar1 = tl::CStrT<char>::operator==((CStrT<char> *)local_20,"TEXCOORD_1");
          if (bVar1) {
            str_local._str._7_1_ = TEXCOORD_1;
          }
          else {
            bVar1 = tl::CStrT<char>::operator==((CStrT<char> *)local_20,"COLOR_0");
            if (bVar1) {
              str_local._str._7_1_ = COLOR;
            }
            else {
              bVar1 = tl::CStrT<char>::operator==((CStrT<char> *)local_20,"JOINTS_0");
              if (bVar1) {
                str_local._str._7_1_ = JOINTS;
              }
              else {
                bVar1 = tl::CStrT<char>::operator==((CStrT<char> *)local_20,"WEIGHTS_0");
                if (bVar1) {
                  str_local._str._7_1_ = WEIGHTS;
                }
                else {
                  str_local._str._7_1_ = COUNT;
                }
              }
            }
          }
        }
      }
    }
  }
  return str_local._str._7_1_;
}

Assistant:

EAttrib strToEAttrib(CStr str)
{
    if(str == "POSITION") return EAttrib::POSITION;
    if(str == "NORMAL") return EAttrib::NORMAL;
    if(str == "TANGENT") return EAttrib::TANGENT;
    //if(str == "COTANGENT") return EAttrib::COTANGENT; // this one is not the gltf spec
    if(str == "TEXCOORD_0") return EAttrib::TEXCOORD_0;
    if(str == "TEXCOORD_1") return EAttrib::TEXCOORD_1;
    if(str == "COLOR_0") return EAttrib::COLOR;
    if(str == "JOINTS_0") return EAttrib::JOINTS;
    if(str == "WEIGHTS_0") return EAttrib::WEIGHTS;
    return EAttrib::COUNT;
}